

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_Detail::M1,_Detail::M3<8>,_Detail::M3<-19>,_Detail::M3<-14>,_Detail::M3<-11>,_Detail::M3<-7>,_Detail::M3<-13>,_Detail::M0,_Detail::NoTempering>,_3498005132U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_Detail::M1,_Detail::M3<8>,_Detail::M3<_19>,_Detail::M3<_14>,_Detail::M3<_11>,_Detail::M3<_7>,_Detail::M3<_13>,_Detail::M0,_Detail::NoTempering>,_3498005132U>
           *this)

{
  result_type rVar1;
  long lVar2;
  int iVar3;
  uint *p;
  uint state [32];
  uint *local_a0;
  uint local_98 [34];
  
  for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 4) {
    *(undefined4 *)((long)local_98 + lVar2) = 1;
  }
  local_a0 = local_98;
  Well<unsigned_int,32ul,32ul,0ul,3ul,24ul,10ul,Detail::M1,Detail::M3<8>,Detail::M3<-19>,Detail::M3<-14>,Detail::M3<-11>,Detail::M3<-7>,Detail::M3<-13>,Detail::M0,Detail::NoTempering>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,32ul,0ul,3ul,24ul,10ul,Detail::M1,Detail::M3<8>,Detail::M3<_19>,Detail::M3<_14>,Detail::M3<_11>,Detail::M3<_7>,Detail::M3<_13>,Detail::M0,Detail::NoTempering>
              *)this,&local_a0,local_98 + 0x20);
  rVar1 = 0;
  for (iVar3 = -1000000000; iVar3 != 0; iVar3 = iVar3 + 1) {
    rVar1 = Well<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_Detail::M1,_Detail::M3<8>,_Detail::M3<-19>,_Detail::M3<-14>,_Detail::M3<-11>,_Detail::M3<-7>,_Detail::M3<-13>,_Detail::M0,_Detail::NoTempering>
            ::operator()(&this->rng);
  }
  return rVar1;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }